

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O3

void absl::flags_internal::ForEachFlag(function<void_(absl::CommandLineFlag_&)> *visitor)

{
  pointer ppCVar1;
  bool bVar2;
  FlagRegistry *this;
  reference ppVar3;
  CommandLineFlag **i;
  pointer ppCVar4;
  iterator __begin2;
  iterator local_48;
  iterator local_38;
  
  this = FlagRegistry::GlobalRegistry();
  if (((this->finalized_flags_)._M_base._M_i & 1U) != 0) {
    ppCVar1 = (this->flat_flags_).
              super__Vector_base<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar4 = (this->flat_flags_).
                   super__Vector_base<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
        ppCVar4 = ppCVar4 + 1) {
      if ((visitor->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001262f5;
      (*visitor->_M_invoker)((_Any_data *)visitor,*ppCVar4);
    }
  }
  Mutex::Lock(&this->lock_);
  local_38 = container_internal::
             raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
             ::begin((raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
                      *)this);
  local_48.ctrl_ = (ctrl_t *)0x0;
  bVar2 = container_internal::operator==(&local_38,&local_48);
  if (!bVar2) {
    do {
      ppVar3 = container_internal::
               raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
               ::iterator::operator*(&local_38);
      if ((visitor->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001262f5:
        std::__throw_bad_function_call();
      }
      (*visitor->_M_invoker)((_Any_data *)visitor,ppVar3->second);
      container_internal::
      raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
      ::iterator::operator++(&local_38);
      bVar2 = container_internal::operator==(&local_38,&local_48);
    } while (!bVar2);
  }
  Mutex::Unlock(&this->lock_);
  return;
}

Assistant:

void ForEachFlag(std::function<void(CommandLineFlag&)> visitor) {
  FlagRegistry& registry = FlagRegistry::GlobalRegistry();

  if (registry.finalized_flags_.load(std::memory_order_acquire)) {
    for (const auto& i : registry.flat_flags_) visitor(*i);
  }

  FlagRegistryLock frl(registry);
  for (const auto& i : registry.flags_) visitor(*i.second);
}